

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitAwait(RegSlot resultReg,RegSlot inputReg,ByteCodeGenerator *byteCodeGenerator,
              FuncInfo *funcInfo)

{
  RegSlot instance;
  uint cacheId;
  ByteCodeLabel resumeNormalLabel;
  ByteCodeWriter *this;
  ByteCodeLabel resumeNormal;
  ByteCodeWriter *writer;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  RegSlot inputReg_local;
  RegSlot resultReg_local;
  
  this = ByteCodeGenerator::Writer(byteCodeGenerator);
  instance = funcInfo->awaitRegister;
  cacheId = FuncInfo::FindOrAddInlineCacheId(funcInfo,funcInfo->awaitRegister,0x197,false,true);
  Js::ByteCodeWriter::PatchableProperty(this,StFld,inputReg,instance,cacheId,false,true);
  resumeNormalLabel = Js::ByteCodeWriter::DefineLabel(this);
  EmitYieldAndResume(resultReg,funcInfo->awaitRegister,resumeNormalLabel,-1,byteCodeGenerator,
                     funcInfo);
  Js::ByteCodeWriter::Reg1(this,Throw,resultReg);
  Js::ByteCodeWriter::MarkLabel(this,resumeNormalLabel);
  return;
}

Assistant:

void EmitAwait(
    Js::RegSlot resultReg,
    Js::RegSlot inputReg,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{

    auto writer = byteCodeGenerator->Writer();
    writer->PatchableProperty(
        Js::OpCode::StFld,
        inputReg,
        funcInfo->awaitRegister,
        funcInfo->FindOrAddInlineCacheId(funcInfo->awaitRegister, Js::PropertyIds::value, false, true));
    Js::ByteCodeLabel resumeNormal = writer->DefineLabel();

    EmitYieldAndResume(
        resultReg,
        funcInfo->awaitRegister,
        resumeNormal,
        Js::Constants::NoByteCodeLabel,
        byteCodeGenerator,
        funcInfo);

    // Throw case: throw the resume value
    writer->Reg1(Js::OpCode::Throw, resultReg);

    // Normal case: continue (value is already in result register)
    writer->MarkLabel(resumeNormal);
}